

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

Type __thiscall wasm::DataFlow::Node::getWasmType(Node *this)

{
  Index i;
  
  do {
    i = 0;
    switch(this->type) {
    case Expr:
      this = (Node *)(this->field_1).expr;
    case Var:
      return (Type)(uintptr_t)(this->field_1).expr;
    case Phi:
      i = 1;
    case Zext:
      this = getValue(this,i);
      break;
    default:
      handle_unreachable("invalid node type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/node.h"
                         ,0xa6);
    case Bad:
      return (Type)1;
    }
  } while( true );
}

Assistant:

wasm::Type getWasmType() {
    switch (type) {
      case Var:
        return wasmType;
      case Expr:
        return expr->type;
      case Phi:
        return getValue(1)->getWasmType();
      case Zext:
        return getValue(0)->getWasmType();
      case Bad:
        return wasm::Type::unreachable;
      default:
        WASM_UNREACHABLE("invalid node type");
    }
  }